

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O3

char * Pla_ReadFile(char *pFileName,char **ppLimit)

{
  FILE *__stream;
  long lVar1;
  char *pcVar2;
  long lVar3;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    puts("Cannot open input file.");
    pcVar2 = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    lVar1 = ftell(__stream);
    rewind(__stream);
    lVar3 = lVar1 << 0x20;
    pcVar2 = (char *)malloc(lVar3 + 0x1000000000 >> 0x20);
    *pcVar2 = '\n';
    fread(pcVar2 + 1,(long)(int)lVar1,1,__stream);
    fclose(__stream);
    pcVar2[lVar3 + 0x100000000 >> 0x20] = '\n';
    pcVar2[lVar3 + 0x200000000 >> 0x20] = '\0';
    *ppLimit = pcVar2 + (long)(int)lVar1 + 3;
  }
  return pcVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Pla_ReadFile( char * pFileName, char ** ppLimit )
{
    char * pBuffer;
    int nFileSize, RetValue;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file.\n" );
        return NULL;
    }
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile );  
    // move the file current reading position to the beginning
    rewind( pFile ); 
    // load the contents of the file into memory
    pBuffer = ABC_ALLOC( char, nFileSize + 16 );
    pBuffer[0] = '\n';
    RetValue = fread( pBuffer+1, nFileSize, 1, pFile );
    fclose( pFile );
    // terminate the string with '\0'
    pBuffer[nFileSize + 1] = '\n';
    pBuffer[nFileSize + 2] = '\0';
    *ppLimit = pBuffer + nFileSize + 3;
    return pBuffer;
}